

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptGetNextOpt(poptContext con)

{
  char cVar1;
  pbm_set *ppVar2;
  poptBits *bitsp;
  poptItem ppVar3;
  char **ppcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  __gid_t __gid;
  __uid_t __uid;
  int iVar8;
  char *pcVar9;
  int *piVar10;
  poptArgv ppcVar11;
  size_t sVar12;
  poptString pcVar13;
  char *pcVar14;
  char **__argv;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  char *__s;
  char *pcVar20;
  poptContext ppVar21;
  size_t longNameLen;
  long lVar22;
  bool bVar23;
  poptBits ppVar24;
  double dVar25;
  int iStackY_80;
  poptOption *local_68;
  char *local_60;
  char **local_58;
  char *local_50;
  void *cbData;
  poptCallbackType cb;
  uint local_34;
  
  if (con == (poptContext)0x0) {
    return -1;
  }
  pcVar20 = (char *)0x0;
  local_68 = (poptOption *)0x0;
LAB_001031bd:
  if ((int)pcVar20 != 0) {
    if (local_68 != (poptOption *)0x0) {
      return local_68->val;
    }
    return -1;
  }
  cb = (poptCallbackType)0x0;
  cbData = (void *)0x0;
LAB_001031d7:
  ppVar21 = (poptContext)con->os;
  if (ppVar21->optionStack[0].nextCharArg == (char *)0x0) {
    uVar5 = ppVar21->optionStack[0].argc;
    uVar7 = ppVar21->optionStack[0].next;
    if ((con < ppVar21) && (uVar7 == uVar5)) goto code_r0x001031fd;
    if (uVar7 == uVar5) {
      invokeCallbacksPOST(con,con->options);
      if (con->maincall != (_func_int_int_char_ptr_ptr *)0x0) {
        (*con->maincall)(con->finalArgvCount,con->finalArgv);
        return -1;
      }
      ppVar3 = con->doExec;
      if (ppVar3 == (poptItem)0x0) {
        return -1;
      }
      ppcVar4 = ppVar3->argv;
      if (ppcVar4 == (char **)0x0) {
        return -10;
      }
      iVar6 = ppVar3->argc;
      if ((long)iVar6 < 1) {
        return -10;
      }
      if ((con->execAbsolute == 0) && (pcVar20 = strchr(*ppcVar4,0x2f), pcVar20 != (char *)0x0)) {
        return -10;
      }
      __argv = (char **)malloc(((long)iVar6 + (long)con->finalArgvCount + (long)con->numLeftovers) *
                               8 + 0x30);
      if (__argv == (char **)0x0) {
        return -0x15;
      }
      pcVar20 = *ppcVar4;
      pcVar9 = strchr(pcVar20,0x2f);
      if ((pcVar9 == (char *)0x0) && (pcVar9 = con->execPath, pcVar9 != (char *)0x0)) {
        sVar12 = strlen(pcVar9);
        sVar15 = strlen(pcVar20);
        pcVar14 = (char *)malloc(sVar12 + sVar15 + 2);
        if (pcVar14 != (char *)0x0) {
          pcVar9 = stpcpy(pcVar14,pcVar9);
          pcVar9[0] = '/';
          pcVar9[1] = '\0';
          pcVar9 = pcVar9 + 1;
          pcVar20 = *ppVar3->argv;
LAB_00103d09:
          strcpy(pcVar9,pcVar20);
          *__argv = pcVar14;
          goto LAB_00103d12;
        }
      }
      else if (pcVar20 != (char *)0x0) {
        pcVar9 = strchr(pcVar20,0x2f);
        if (pcVar9 != (char *)0x0) {
          sVar12 = strlen(pcVar20);
          pcVar9 = (char *)malloc(sVar12 + 1);
          pcVar14 = pcVar9;
          if (pcVar9 != (char *)0x0) goto LAB_00103d09;
          goto LAB_00103f50;
        }
        pcVar9 = getenv("PATH");
        if (pcVar9 != (char *)0x0) {
          sVar12 = strlen(pcVar9);
          pcVar14 = (char *)malloc(sVar12 + 1);
          if (pcVar14 == (char *)0x0) goto LAB_00103f50;
          strcpy(pcVar14,pcVar9);
          sVar12 = strlen(pcVar14);
          sVar15 = strlen(pcVar20);
          pcVar16 = (char *)malloc(sVar12 + sVar15 + 2);
          pcVar9 = pcVar14;
          if (pcVar16 != (char *)0x0) goto LAB_00103ea3;
          pcVar16 = (char *)0x0;
          goto LAB_00103f37;
        }
      }
      *__argv = (char *)0x0;
      goto LAB_00103f18;
    }
    ppVar2 = ppVar21->optionStack[0].argb;
    if ((ppVar2 != (pbm_set *)0x0) &&
       ((ppVar2[(ulong)(long)(int)uVar7 >> 5].bits[0] >> (uVar7 & 0x1f) & 1) != 0)) {
      ppVar21->optionStack[0].next = uVar7 + 1;
      pcVar20 = (char *)0x0;
      goto LAB_001031bd;
    }
    ppcVar11 = ppVar21->optionStack[0].argv;
    if (ppcVar11 == (poptArgv)0x0) {
      return -0xb;
    }
    ppVar21->optionStack[0].next = uVar7 + 1;
    pcVar9 = ppcVar11[(int)uVar7];
    if (pcVar9 == (char *)0x0) {
      return -0xb;
    }
    if (((con->restLeftover == 0) && (*pcVar9 == '-')) && (cVar1 = pcVar9[1], cVar1 != '\0')) {
      uVar5 = 0x80000000;
      if ((cVar1 == '-') && (uVar5 = 0, pcVar9[2] == '\0')) {
        con->restLeftover = 1;
        pcVar20 = (char *)0x0;
      }
      else {
        pcVar14 = pcVar9 + 1;
        local_58 = (char **)CONCAT71(local_58._1_7_,cVar1);
        pcVar9 = pcVar9 + 2;
        if (cVar1 != '-') {
          pcVar9 = pcVar14;
        }
        for (longNameLen = 0; (cVar1 = pcVar9[longNameLen], cVar1 != '\0' && (cVar1 != '='));
            longNameLen = longNameLen + 1) {
        }
        pcVar20 = (char *)0x0;
        local_50 = pcVar9 + longNameLen + 1;
        if (cVar1 != '=') {
          local_50 = pcVar20;
        }
        local_34 = uVar5;
        iVar6 = handleAlias(con,pcVar9,longNameLen,'\0',local_50);
        if (iVar6 == 0) {
          pcVar20 = (char *)0x0;
          iVar6 = handleExec(con,pcVar9,'\0');
          if (iVar6 == 0) {
            bVar23 = (char)local_58 == '-';
            local_68 = findOption(con->options,pcVar9,longNameLen,'\0',&cb,&cbData,local_34);
            if (bVar23 && local_68 == (poptOption *)0x0) {
              return -0xb;
            }
            ppVar21 = (poptContext)con->os;
            if (local_68 != (poptOption *)0x0) {
              if ((ppVar21 == con) && ((local_68->argInfo & 0x20000000) != 0)) {
                poptStripArg(con,uVar7);
                ppVar21 = (poptContext)con->os;
                bVar23 = true;
                pcVar9 = local_50;
              }
              else {
                bVar23 = false;
                pcVar9 = local_50;
              }
              goto LAB_00103217;
            }
            ppVar21->optionStack[0].nextCharArg = pcVar14;
            local_68 = (poptOption *)0x0;
            bVar23 = false;
            pcVar9 = (char *)0x0;
            goto LAB_0010322d;
          }
        }
      }
      goto LAB_001031bd;
    }
    if ((con->flags & 4) != 0) {
      con->restLeftover = 1;
    }
    if ((con->flags & 0x10) != 0) {
      sVar12 = strlen(pcVar9);
      pcVar20 = (char *)malloc(sVar12 + 1);
      if (pcVar20 != (char *)0x0) {
        strcpy(pcVar20,pcVar9);
        ppVar21->optionStack[0].nextArg = pcVar20;
        return 0;
      }
      goto LAB_00103f50;
    }
    ppcVar11 = con->leftovers;
    pcVar20 = (char *)0x0;
    if (ppcVar11 == (poptArgv)0x0) goto LAB_001031bd;
    iVar6 = con->allocLeftovers;
    if (iVar6 <= con->numLeftovers + 1) {
      con->allocLeftovers = iVar6 + 10;
      ppcVar11 = (poptArgv)realloc(ppcVar11,(long)iVar6 * 8 + 0x50);
      con->leftovers = ppcVar11;
    }
    sVar12 = strlen(pcVar9);
    pcVar14 = (char *)malloc(sVar12 + 1);
    if (pcVar14 == (char *)0x0) goto LAB_00103f50;
    strcpy(pcVar14,pcVar9);
    iVar6 = con->numLeftovers;
    con->numLeftovers = iVar6 + 1;
    ppcVar11[iVar6] = pcVar14;
    goto LAB_001031bd;
  }
  bVar23 = false;
  pcVar9 = (char *)0x0;
LAB_00103217:
  pcVar14 = ppVar21->optionStack[0].nextCharArg;
  if (pcVar14 != (char *)0x0) goto LAB_0010322d;
  iStackY_80 = 0;
  if (local_68 == (poptOption *)0x0) {
    return -0xb;
  }
  goto LAB_001033ec;
code_r0x001031fd:
  con->os = (optionStackEntry *)&ppVar21[-1].finalArgv;
  cleanOSE((optionStackEntry *)ppVar21);
  goto LAB_001031d7;
LAB_0010322d:
  ppVar21->optionStack[0].nextCharArg = (char *)0x0;
  pcVar16 = pcVar14 + 1;
  pcVar20 = (char *)0x0;
  iVar6 = handleAlias(con,(char *)0x0,0,*pcVar14,pcVar16);
  if (iVar6 != 0) goto LAB_001031bd;
  iVar6 = handleExec(con,(char *)0x0,*pcVar14);
  if (iVar6 != 0) {
    if (*pcVar16 != '\0') {
      con->os->nextCharArg = pcVar16;
    }
    goto LAB_001031bd;
  }
  local_68 = findOption(con->options,(char *)0x0,0,*pcVar14,&cb,&cbData,0);
  if (local_68 == (poptOption *)0x0) {
    return -0xb;
  }
  if (*pcVar16 != '\0') {
    con->os->nextCharArg = pcVar16;
  }
  iStackY_80 = 1;
LAB_001033ec:
  uVar5 = _poptArgMask & local_68->argInfo;
  if ((uVar5 == 7) || (uVar5 == 0)) {
    if ((pcVar9 != (char *)0x0) ||
       ((pcVar20 = con->os->nextCharArg, pcVar20 != (char *)0x0 && (*pcVar20 == '=')))) {
      return -0xc;
    }
    piVar10 = (int *)local_68->arg;
    if (piVar10 != (int *)0x0) {
      lVar22 = 1;
      if (uVar5 == 7) {
        lVar22 = (long)local_68->val;
      }
      uVar5 = poptArgInfo(con,local_68);
      iVar6 = poptSaveInt(piVar10,uVar5,lVar22);
      if (iVar6 != 0) {
        return -0x13;
      }
    }
    goto LAB_001038b3;
  }
  free(con->os->nextArg);
  ppVar21 = (poptContext)con->os;
  ppVar21->optionStack[0].nextArg = (char *)0x0;
  if (pcVar9 == (char *)0x0) {
    pcVar20 = ppVar21->optionStack[0].nextCharArg;
    if (pcVar20 == (char *)0x0) {
      while( true ) {
        uVar5 = ppVar21->optionStack[0].argc;
        uVar7 = ppVar21->optionStack[0].next;
        pcVar9 = (char *)(ulong)uVar7;
        if ((ppVar21 <= con) || (uVar7 != uVar5)) break;
        con->os = (optionStackEntry *)&ppVar21[-1].finalArgv;
        cleanOSE(ppVar21->optionStack);
        ppVar21 = (poptContext)con->os;
      }
      if (uVar7 == uVar5) {
        if ((local_68->argInfo & 0x10000000) == 0) {
          return -10;
        }
      }
      else {
        if ((ppVar21 == con) && (bVar23 && (local_68->argInfo & 0x20000000) != 0)) {
          poptStripArg(con,uVar7);
          ppVar21 = (poptContext)con->os;
        }
        ppcVar11 = ppVar21->optionStack[0].argv;
        if (ppcVar11 == (poptArgv)0x0) goto LAB_00103682;
        iVar6 = ppVar21->optionStack[0].next;
        pcVar9 = ppcVar11[iVar6];
        if (((local_68->argInfo & 0x10000000) == 0) || (*pcVar9 != '-')) {
          ppVar21->optionStack[0].next = iVar6 + 1;
          goto LAB_0010348f;
        }
      }
      uVar7 = (uint)pcVar9;
      ppVar21->optionStack[0].nextArg = (char *)0x0;
    }
    else {
      pcVar20 = pcVar20 + (*pcVar20 == '=');
      pcVar9 = expandNextArg(con,pcVar20);
      uVar7 = (uint)pcVar20;
      ppVar21 = (poptContext)con->os;
      ppVar21->optionStack[0].nextArg = pcVar9;
      ppVar21->optionStack[0].nextCharArg = (char *)0x0;
    }
  }
  else {
LAB_0010348f:
    pcVar20 = expandNextArg(con,pcVar9);
    uVar7 = (uint)pcVar9;
    ppVar21 = (poptContext)con->os;
    ppVar21->optionStack[0].nextArg = pcVar20;
  }
LAB_00103682:
  uVar5 = _poptArgMask;
  bitsp = (poptBits *)local_68->arg;
  if (bitsp == (poptBits *)0x0) goto LAB_001038b3;
  uVar19 = local_68->argInfo;
  uVar18 = _poptArgMask & uVar19;
  switch(uVar18) {
  case 1:
    pcVar20 = ppVar21->optionStack[0].nextArg;
    if (pcVar20 == (char *)0x0) {
      ppVar24 = (poptBits)0x0;
    }
    else {
      sVar12 = strlen(pcVar20);
      ppVar24 = (poptBits)malloc(sVar12 + 1);
      if (ppVar24 == (poptBits)0x0) goto LAB_00103f50;
      strcpy((char *)ppVar24,pcVar20);
    }
    *bitsp = ppVar24;
    goto LAB_001038b3;
  case 2:
  case 3:
  case 10:
  case 0xd:
    uVar7 = poptArgInfo(con,local_68);
    pcVar20 = ppVar21->optionStack[0].nextArg;
    if (pcVar20 == (char *)0x0) {
      lVar22 = 0;
    }
    else {
      local_60 = (char *)0x0;
      lVar22 = strtoll(pcVar20,&local_60,0);
      if ((local_60 == (char *)0x0) || (*local_60 != '\0')) {
        return -0x11;
      }
      uVar19 = local_68->argInfo;
      uVar5 = _poptArgMask;
    }
    uVar5 = uVar5 & uVar19;
    if (uVar5 == 2) {
      if ((int)lVar22 != lVar22) {
        return -0x12;
      }
      iVar6 = poptSaveInt((int *)bitsp,uVar7,lVar22);
    }
    else if (uVar5 == 3) {
      iVar6 = poptSaveLong((long *)bitsp,uVar7,lVar22);
    }
    else if (uVar5 == 0xd) {
      if ((short)lVar22 != lVar22) {
        return -0x12;
      }
      iVar6 = poptSaveShort((short *)bitsp,uVar7,lVar22);
    }
    else {
      if (uVar5 != 10) goto LAB_001038b3;
      if (lVar22 + 0x8000000000000001U < 2) {
        return -0x12;
      }
      iVar6 = poptSaveLongLong((longlong *)bitsp,uVar7,lVar22);
    }
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
switchD_001036b8_caseD_4:
    fprintf(_stdout,"option type (%u) not implemented in popt\n");
    goto LAB_00103f6c;
  case 8:
  case 9:
    local_60 = (char *)0x0;
    pcVar20 = ppVar21->optionStack[0].nextArg;
    if (pcVar20 == (char *)0x0) {
      ppVar24 = (poptBits)0x0;
LAB_00103a58:
      iVar6 = 0;
      if ((_poptArgMask & uVar19) == 8) {
        dVar25 = (double)(~-(ulong)((double)ppVar24 < 2.220446049250313e-16) & (ulong)ppVar24 |
                         ((ulong)ppVar24 ^ 0x8000000000000000) &
                         -(ulong)((double)ppVar24 < 2.220446049250313e-16));
        iVar6 = -0x12;
        if ((1.1754943508222875e-38 - dVar25 <= 2.220446049250313e-16) &&
           (dVar25 + -3.4028234663852886e+38 <= 2.220446049250313e-16)) {
          *(float *)bitsp = (float)(double)ppVar24;
          goto LAB_00103ae6;
        }
      }
      else if ((_poptArgMask & uVar19) == 9) {
        *bitsp = ppVar24;
LAB_00103ae6:
        iVar6 = 0;
      }
    }
    else {
      piVar10 = __errno_location();
      iVar8 = *piVar10;
      *piVar10 = 0;
      ppVar24 = (poptBits)strtod(pcVar20,&local_60);
      iVar6 = -0x12;
      if (*piVar10 != 0x22) {
        *piVar10 = iVar8;
        iVar6 = -0x11;
        if (*local_60 == '\0') {
          uVar19 = local_68->argInfo;
          goto LAB_00103a58;
        }
      }
    }
    break;
  case 0xc:
    iVar6 = poptSaveString((char ***)bitsp,uVar7,ppVar21->optionStack[0].nextArg);
    break;
  default:
    if (uVar18 != 0x1b) {
      if (uVar18 != 0x1e) goto switchD_001036b8_caseD_4;
      iVar6 = poptSaveBits(bitsp,uVar7,ppVar21->optionStack[0].nextArg);
      break;
    }
    con->maincall = (_func_int_int_char_ptr_ptr *)bitsp;
    goto LAB_001038b3;
  }
  if (iVar6 != 0) {
    return iVar6;
  }
LAB_001038b3:
  if (cb == (poptCallbackType)0x0) {
    if (local_68->val != 0) {
      pcVar20 = (char *)(ulong)((_poptArgMask & local_68->argInfo) != 7);
      goto LAB_001038f8;
    }
  }
  else {
    invokeCallbacksOPTION(con,con->options,local_68,cbData,iStackY_80);
  }
  pcVar20 = (char *)0x0;
LAB_001038f8:
  iVar6 = con->finalArgvAlloced;
  ppcVar11 = con->finalArgv;
  if (iVar6 <= con->finalArgvCount + 2) {
    con->finalArgvAlloced = iVar6 + 10;
    ppcVar11 = (poptArgv)realloc(ppcVar11,(long)iVar6 * 8 + 0x50);
    con->finalArgv = ppcVar11;
  }
  if (ppcVar11 != (poptArgv)0x0) {
    sVar12 = 3;
    if (local_68->longName != (char *)0x0) {
      sVar12 = strlen(local_68->longName);
      sVar12 = sVar12 + 3;
    }
    pcVar13 = (poptString)malloc(sVar12);
    iVar6 = con->finalArgvCount;
    con->finalArgvCount = iVar6 + 1;
    if (pcVar13 == (poptString)0x0) {
      ppcVar11[iVar6] = (poptString)0x0;
    }
    else {
      ppcVar11[iVar6] = pcVar13;
      *pcVar13 = '-';
      pcVar9 = local_68->longName;
      if (pcVar9 == (char *)0x0) {
        pcVar13[1] = local_68->shortName;
        pcVar13[2] = '\0';
      }
      else {
        if ((int)local_68->argInfo < 0) {
          pcVar14 = pcVar13 + 1;
        }
        else {
          pcVar13[1] = '-';
          pcVar14 = pcVar13 + 2;
          pcVar9 = local_68->longName;
        }
        strcpy(pcVar14,pcVar9);
      }
    }
  }
  uVar5 = _poptArgMask & local_68->argInfo;
  if ((((local_68->arg == (void *)0x0 || uVar5 != 0) && (uVar5 != 0)) && (uVar5 != 7)) &&
     ((ppcVar11 = con->finalArgv, ppcVar11 != (poptArgv)0x0 &&
      (pcVar9 = con->os->nextArg, pcVar9 != (char *)0x0)))) {
    sVar12 = strlen(pcVar9);
    pcVar14 = (char *)malloc(sVar12 + 1);
    if (pcVar14 == (char *)0x0) goto LAB_00103f50;
    strcpy(pcVar14,pcVar9);
    iVar6 = con->finalArgvCount;
    con->finalArgvCount = iVar6 + 1;
    ppcVar11[iVar6] = pcVar14;
  }
  goto LAB_001031bd;
  while( true ) {
    pcVar17 = strchr(__s,0x3a);
    if (pcVar17 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar17 + 1;
      *pcVar17 = '\0';
    }
    pcVar17 = stpcpy(pcVar16,__s);
    pcVar17[0] = '/';
    pcVar17[1] = '\0';
    strcpy(pcVar17 + 1,pcVar20);
    iVar6 = access(pcVar16,1);
    __argv = local_58;
    if (iVar6 == 0) break;
LAB_00103ea3:
    local_58 = __argv;
    __s = pcVar9;
    if ((__s == (char *)0x0) || (*__s == '\0')) goto LAB_00103f01;
  }
  if (*__s == '\0') {
LAB_00103f01:
    free(pcVar16);
    pcVar16 = (char *)0x0;
    __argv = local_58;
  }
LAB_00103f37:
  free(pcVar14);
  *__argv = pcVar16;
  if (pcVar16 == (char *)0x0) {
LAB_00103f18:
    iVar6 = -10;
    pcVar20 = (char *)0x0;
  }
  else {
LAB_00103d12:
    uVar5 = ppVar3->argc;
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    else {
      memcpy(__argv + 1,ppVar3->argv + 1,(ulong)(uVar5 - 1) << 3);
    }
    if (con->finalArgv != (poptArgv)0x0) {
      iVar6 = con->finalArgvCount;
      if (0 < (long)iVar6) {
        memcpy(__argv + uVar5,con->finalArgv,(long)iVar6 << 3);
        uVar5 = uVar5 + iVar6;
      }
    }
    if (con->leftovers != (poptArgv)0x0) {
      iVar6 = con->numLeftovers;
      if (0 < (long)iVar6) {
        memcpy(__argv + uVar5,con->leftovers,(long)iVar6 << 3);
        uVar5 = uVar5 + iVar6;
      }
    }
    __argv[uVar5] = (char *)0x0;
    __gid = getgid();
    iVar6 = setgid(__gid);
    if (iVar6 == 0) {
      __uid = getuid();
      iVar8 = setuid(__uid);
      pcVar20 = *__argv;
      iVar6 = -0x10;
      if (iVar8 == 0) {
        execvp(pcVar20,__argv);
        pcVar20 = *__argv;
        sVar12 = strlen(pcVar20);
        pcVar9 = (char *)malloc(sVar12 + 1);
        if (pcVar9 == (char *)0x0) {
LAB_00103f50:
          fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
LAB_00103f6c:
          exit(1);
        }
        strcpy(pcVar9,pcVar20);
        con->execFail = pcVar9;
      }
    }
    else {
      pcVar20 = *__argv;
      iVar6 = -0x10;
    }
  }
  free(pcVar20);
  free(__argv);
  return iVar6;
}

Assistant:

int poptGetNextOpt(poptContext con)
{
    const struct poptOption * opt = NULL;
    int done = 0;

    if (con == NULL)
	return -1;
    while (!done) {
	const char * origOptString = NULL;
	poptCallbackType cb = NULL;
	const void * cbData = NULL;
	const char * longArg = NULL;
	int canstrip = 0;
	int shorty = 0;

	while (!con->os->nextCharArg && con->os->next == con->os->argc
		&& con->os > con->optionStack) {
	    cleanOSE(con->os--);
	}
	if (!con->os->nextCharArg && con->os->next == con->os->argc) {
	    invokeCallbacksPOST(con, con->options);

	    if (con->maincall) {
		(void) (*con->maincall) (con->finalArgvCount, con->finalArgv);
		return -1;
	    }

	    if (con->doExec) return execCommand(con);
	    return -1;
	}

	/* Process next long option */
	if (!con->os->nextCharArg) {
	    const char * optString;
            size_t optStringLen;
	    int thisopt;

	    if (con->os->argb && PBM_ISSET(con->os->next, con->os->argb)) {
		con->os->next++;
		continue;
	    }
	    thisopt = con->os->next;
	    if (con->os->argv != NULL)	/* XXX can't happen */
	    origOptString = con->os->argv[con->os->next++];

	    if (origOptString == NULL)	/* XXX can't happen */
		return POPT_ERROR_BADOPT;

	    if (con->restLeftover || *origOptString != '-' ||
		(*origOptString == '-' && origOptString[1] == '\0'))
	    {
		if (con->flags & POPT_CONTEXT_POSIXMEHARDER)
		    con->restLeftover = 1;
		if (con->flags & POPT_CONTEXT_ARG_OPTS) {
		    con->os->nextArg = xstrdup(origOptString);
		    return 0;
		}
		if (con->leftovers != NULL) {	/* XXX can't happen */
		    /* One might think we can never overflow the leftovers
		       array.  Actually, that's true, as long as you don't
		       use poptStuffArgs()... */
		    if ((con->numLeftovers + 1) >= (con->allocLeftovers)) {
			con->allocLeftovers += 10;
			con->leftovers =
			    realloc(con->leftovers,
				    sizeof(*con->leftovers) * con->allocLeftovers);
		    }
		    con->leftovers[con->numLeftovers++]
			= xstrdup(origOptString); /* so a free of a stuffed
						     argv doesn't give us a
						     dangling pointer */
		}
		continue;
	    }

	    /* Make a copy we can hack at */
	    optString = origOptString;

	    if (optString[0] == '\0')
		return POPT_ERROR_BADOPT;

	    if (optString[1] == '-' && !optString[2]) {
		con->restLeftover = 1;
		continue;
	    } else {
		const char *oe;
		unsigned int argInfo = 0;

		optString++;
		if (*optString == '-')
		    optString++;
		else
		    argInfo |= POPT_ARGFLAG_ONEDASH;

		/* Check for "--long=arg" option. */
		for (oe = optString; *oe && *oe != '='; oe++)
		    {};
		optStringLen = (size_t)(oe - optString);
		if (*oe == '=')
		    longArg = oe + 1;

		/* XXX aliases with arg substitution need "--alias=arg" */
		if (handleAlias(con, optString, optStringLen, '\0', longArg)) {
		    longArg = NULL;
		    continue;
		}

		if (handleExec(con, optString, '\0'))
		    continue;

		opt = findOption(con->options, optString, optStringLen, '\0', &cb, &cbData,
				 argInfo);
		if (!opt && !LF_ISSET(ONEDASH))
		    return POPT_ERROR_BADOPT;
	    }

	    if (!opt) {
		con->os->nextCharArg = origOptString + 1;
		longArg = NULL;
	    } else {
		if (con->os == con->optionStack && F_ISSET(opt, STRIP))
		{
		    canstrip = 1;
		    poptStripArg(con, thisopt);
		}
		shorty = 0;
	    }
	}

	/* Process next short option */
	if (con->os->nextCharArg) {
	    const char * nextCharArg = con->os->nextCharArg;

	    con->os->nextCharArg = NULL;

	    if (handleAlias(con, NULL, 0, *nextCharArg, nextCharArg + 1))
		continue;

	    if (handleExec(con, NULL, *nextCharArg)) {
		/* Restore rest of short options for further processing */
		nextCharArg++;
		if (*nextCharArg != '\0')
		    con->os->nextCharArg = nextCharArg;
		continue;
	    }

	    opt = findOption(con->options, NULL, 0, *nextCharArg, &cb,
			     &cbData, 0);
	    if (!opt)
		return POPT_ERROR_BADOPT;
	    shorty = 1;

	    nextCharArg++;
	    if (*nextCharArg != '\0')
		con->os->nextCharArg = nextCharArg;
	}

	if (opt == NULL) return POPT_ERROR_BADOPT;	/* XXX can't happen */
	if (poptArgType(opt) == POPT_ARG_NONE || poptArgType(opt) == POPT_ARG_VAL) {
	    if (longArg || (con->os->nextCharArg && con->os->nextCharArg[0] == '='))
		return POPT_ERROR_UNWANTEDARG;
	    if (opt->arg) {
		long val = poptArgType(opt) == POPT_ARG_VAL ? opt->val : 1;
		unsigned int argInfo = poptArgInfo(con, opt);
		if (poptSaveInt((int *)opt->arg, argInfo, val))
		    return POPT_ERROR_BADOPERATION;
	    }
	} else {
	    int rc;

	    con->os->nextArg = _free(con->os->nextArg);
	    if (longArg) {
		longArg = expandNextArg(con, longArg);
		con->os->nextArg = (char *) longArg;
	    } else if (con->os->nextCharArg) {
		longArg = expandNextArg(con, con->os->nextCharArg + (int)(*con->os->nextCharArg == '='));
		con->os->nextArg = (char *) longArg;
		con->os->nextCharArg = NULL;
	    } else {
		while (con->os->next == con->os->argc &&
			con->os > con->optionStack)
		{
		    cleanOSE(con->os--);
		}
		if (con->os->next == con->os->argc) {
		    if (!F_ISSET(opt, OPTIONAL))
			return POPT_ERROR_NOARG;
		    con->os->nextArg = NULL;
		} else {

		    /*
		     * Make sure this isn't part of a short arg or the
		     * result of an alias expansion.
		     */
		    if (con->os == con->optionStack
		     && F_ISSET(opt, STRIP) && canstrip)
		    {
			poptStripArg(con, con->os->next);
		    }
		
		    if (con->os->argv != NULL) {	/* XXX can't happen */
			if (F_ISSET(opt, OPTIONAL) &&
			    con->os->argv[con->os->next][0] == '-') {
			    con->os->nextArg = NULL;
			} else {
			    /* XXX watchout: subtle side-effects live here. */
			    longArg = con->os->argv[con->os->next++];
			    longArg = expandNextArg(con, longArg);
			    con->os->nextArg = (char *) longArg;
			}
		    }
		}
	    }
	    longArg = NULL;

	   /* Save the option argument through a (*opt->arg) pointer. */
	    if (opt->arg != NULL && (rc = poptSaveArg(con, opt)) != 0)
		return rc;
	}

	if (cb)
	    invokeCallbacksOPTION(con, con->options, opt, cbData, shorty);
	else if (opt->val && (poptArgType(opt) != POPT_ARG_VAL))
	    done = 1;

	if ((con->finalArgvCount + 2) >= (con->finalArgvAlloced)) {
	    con->finalArgvAlloced += 10;
	    con->finalArgv = realloc(con->finalArgv,
			    sizeof(*con->finalArgv) * con->finalArgvAlloced);
	}

	if (con->finalArgv != NULL)
	{   char *s = malloc((opt->longName ? strlen(opt->longName) : 0) + sizeof("--"));
	    if (s != NULL) {	/* XXX can't happen */
		con->finalArgv[con->finalArgvCount++] = s;
		*s++ = '-';
		if (opt->longName) {
		    if (!F_ISSET(opt, ONEDASH))
			*s++ = '-';
		    s = stpcpy(s, opt->longName);
		} else {
		    *s++ = opt->shortName;
		    *s = '\0';
		}
	    } else
		con->finalArgv[con->finalArgvCount++] = NULL;
	}

	if (opt->arg && poptArgType(opt) == POPT_ARG_NONE)
	    ;
	else if (poptArgType(opt) == POPT_ARG_VAL)
	    ;
	else if (poptArgType(opt) != POPT_ARG_NONE) {
	    if (con->finalArgv != NULL && con->os->nextArg != NULL)
	        con->finalArgv[con->finalArgvCount++] =
			xstrdup(con->os->nextArg);
	}
    }

    return (opt ? opt->val : -1);	/* XXX can't happen */
}